

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  ulong uVar1;
  
  _generate_nonce = nonce_override_generate_nonce;
  uVar1 = paseto_init();
  if ((uVar1 & 1) == 0) {
    __assert_fail("paseto_init()",
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/main.c"
                  ,9,"int main()");
  }
  run_tests();
  test_v2vectors();
  test_v2publicvectors();
  return 0;
}

Assistant:

int main() {
    generate_nonce = nonce_override_generate_nonce;
    assert(paseto_init());
    run_tests();
    test_v2vectors();
    test_v2publicvectors();
}